

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O0

void vtt_free(vtt_t *vtt)

{
  vtt_block_t *pvVar1;
  long *in_RDI;
  
  while (*in_RDI != 0) {
    pvVar1 = vtt_block_free_head((vtt_block_t *)vtt);
    *in_RDI = (long)pvVar1;
  }
  while (in_RDI[2] != 0) {
    pvVar1 = vtt_block_free_head((vtt_block_t *)vtt);
    in_RDI[2] = (long)pvVar1;
  }
  while (in_RDI[4] != 0) {
    pvVar1 = vtt_block_free_head((vtt_block_t *)vtt);
    in_RDI[4] = (long)pvVar1;
  }
  free(in_RDI);
  return;
}

Assistant:

void vtt_free(vtt_t* vtt)
{
    while (vtt->region_head != NULL) {
        vtt->region_head = vtt_block_free_head(vtt->region_head);
    }
    while (vtt->style_head != NULL) {
        vtt->style_head = vtt_block_free_head(vtt->style_head);
    }
    while (vtt->cue_head != NULL) {
        vtt->cue_head = vtt_block_free_head(vtt->cue_head);
    }
    free(vtt);
}